

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QStyleSheetStyle::drawPrimitive
          (QStyleSheetStyle *this,PrimitiveElement pe,QStyleOption *opt,QPainter *p,QWidget *w)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Int IVar4;
  QStyle *pQVar5;
  QStyleOptionHeader *pQVar6;
  QAbstractButton *pQVar7;
  ulong uVar8;
  QRenderRule *pQVar9;
  QStyleOptionFrame *pQVar10;
  QStyleOptionTabWidgetFrame *pQVar11;
  QStyleOptionViewItem *pQVar12;
  QRenderRule *in_RCX;
  QStyleOption *in_RDX;
  int in_ESI;
  QStyleSheetStyle *in_RDI;
  QRenderRule *in_R8;
  long in_FS_OFFSET;
  QRect QVar13;
  QStyleOptionViewItem *vopt_1;
  QStyleOptionTabWidgetFrame *frm_2;
  QStyleOptionFrame *frmOpt_2;
  QStyleOptionViewItem *vopt;
  bool reverse;
  QStyleOptionViewItem *viewOpt;
  PseudoElement ps;
  QAbstractScrollAreaPrivate *sap;
  QAbstractScrollArea *sa;
  QWidget *container;
  QStyleOptionFrame *frm_1;
  QStyleOptionFrame *frm;
  QStyleOptionHeader *hdr;
  int pseudoElement;
  QRect r;
  QRect brect;
  QWidget *container_1;
  QRect rect;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule subRule_5;
  QRenderRule rule_1;
  QStyleOptionTabWidgetFrame frmCopy;
  QRenderRule subRule_4;
  QStyleOptionFrame optCopy;
  QRenderRule subRule_3;
  QRenderRule subRule_2;
  QStyleOptionFrame frmOpt_1;
  QRenderRule containerRule;
  QStyleOptionFrame frmOpt;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QRenderRule rule;
  int in_stack_fffffffffffff618;
  ViewItemFeature in_stack_fffffffffffff61c;
  QRenderRule *in_stack_fffffffffffff620;
  undefined7 in_stack_fffffffffffff628;
  undefined1 in_stack_fffffffffffff62f;
  QRenderRule *in_stack_fffffffffffff630;
  QRenderRule *in_stack_fffffffffffff638;
  QRect *in_stack_fffffffffffff640;
  int in_stack_fffffffffffff648;
  LayoutDirection in_stack_fffffffffffff64c;
  QRect *in_stack_fffffffffffff650;
  QRenderRule *in_stack_fffffffffffff658;
  QRect *rect_00;
  QRenderRule *in_stack_fffffffffffff660;
  QRenderRule *in_stack_fffffffffffff668;
  QRenderRule *this_00;
  byte local_94a;
  byte local_949;
  undefined8 in_stack_fffffffffffff6b8;
  QPalette *in_stack_fffffffffffff6c0;
  QRenderRule *in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff74c;
  QAbstractScrollAreaPrivate *in_stack_fffffffffffff750;
  QRect *in_stack_fffffffffffff758;
  uint7 in_stack_fffffffffffff760;
  byte in_stack_fffffffffffff767;
  QRenderRule *in_stack_fffffffffffff768;
  int local_878;
  int local_874;
  QRenderRule *local_870;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_824;
  QBrush local_818 [8];
  QRect local_810;
  QPoint in_stack_fffffffffffff808;
  undefined8 local_7a8;
  undefined8 local_7a0;
  QStyleSheetStyleRecursionGuard local_739;
  undefined1 local_738 [136];
  undefined1 local_6b0 [136];
  undefined1 local_628 [136];
  undefined1 local_5a0 [136];
  undefined1 local_518 [16];
  undefined8 local_508;
  undefined8 local_500;
  undefined1 local_4c8 [24];
  QWidget *in_stack_fffffffffffffb50;
  QPainter *in_stack_fffffffffffffb58;
  QStyleOption *in_stack_fffffffffffffb60;
  PrimitiveElement in_stack_fffffffffffffb6c;
  QWindowsStyle *in_stack_fffffffffffffb70;
  undefined1 local_440 [272];
  undefined1 local_330 [16];
  undefined8 local_320;
  undefined8 local_318;
  int local_2f0;
  undefined1 local_2e0 [136];
  undefined1 local_258 [80];
  undefined1 local_208 [136];
  undefined1 local_180 [136];
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar5 = baseStyle((QStyleSheetStyle *)
                       CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,in_RDX,in_RCX,in_R8);
    goto LAB_00439dc3;
  }
  local_739.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_739,in_RDI);
  local_874 = 0;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
             in_stack_fffffffffffff74c);
  local_870 = in_R8;
  switch(in_ESI) {
  case 0:
  case 2:
  case 9:
    pQVar10 = qstyleoption_cast<QStyleOptionFrame_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionFrame *)0x0) {
      bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
      if (bVar1) {
        memset(local_258,0xaa,0x50);
        QStyleOptionFrame::QStyleOptionFrame
                  ((QStyleOptionFrame *)in_stack_fffffffffffff620,
                   (QStyleOptionFrame *)
                   CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        QRenderRule::configurePalette
                  (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                   (ColorRole)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                   (ColorRole)in_stack_fffffffffffff6b8);
        pQVar5 = baseStyle((QStyleSheetStyle *)
                           CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
        (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,local_258,in_RCX,in_R8);
        QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x4389a6);
      }
      else {
        QRenderRule::borderRect(in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630);
        QRenderRule::drawBorder
                  (in_stack_fffffffffffff660,(QPainter *)in_stack_fffffffffffff658,
                   in_stack_fffffffffffff650);
      }
    }
    goto LAB_00439da9;
  case 1:
    bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
    if (bVar1) {
      bVar1 = QRenderRule::baseStyleCanDraw
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      if (bVar1) break;
      QWindowsStyle::drawPrimitive
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    }
    goto LAB_00439da9;
  case 3:
    bVar1 = QRenderRule::hasNativeOutline(in_stack_fffffffffffff630);
    if (bVar1) break;
    QRenderRule::drawOutline
              (in_stack_fffffffffffff660,(QPainter *)in_stack_fffffffffffff658,
               in_stack_fffffffffffff650);
    goto LAB_00439da9;
  case 4:
    bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
    if (bVar1) break;
    QRenderRule::drawBorder
              (in_stack_fffffffffffff660,(QPainter *)in_stack_fffffffffffff658,
               in_stack_fffffffffffff650);
    goto LAB_00439da9;
  default:
    break;
  case 6:
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    goto joined_r0x0043929f;
  case 7:
    memset(local_180,0xaa,0x88);
    if (in_R8 != (QRenderRule *)0x0) {
      QWidget::parentWidget((QWidget *)0x4384c0);
    }
    renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
               (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    if (bVar1) {
      QRenderRule::drawRule
                (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                 (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      local_878 = 1;
    }
    else {
      local_878 = 2;
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
    goto joined_r0x00438866;
  case 8:
    pQVar11 = qstyleoption_cast<QStyleOptionTabWidgetFrame_const*>(in_RDX);
    if (pQVar11 == (QStyleOptionTabWidgetFrame *)0x0) break;
    memset(local_5a0,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
               (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
    if (bVar1) {
      rect_00 = &in_RDX->rect;
      pQVar9 = in_RCX;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                     in_stack_fffffffffffff618);
      QRenderRule::drawBackground
                (in_stack_fffffffffffff668,(QPainter *)in_stack_fffffffffffff660,rect_00,
                 (QPoint *)pQVar9);
      memset(local_628,0xaa,0x88);
      QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame
                ((QStyleOptionTabWidgetFrame *)in_stack_fffffffffffff620,
                 (QStyleOptionTabWidgetFrame *)
                 CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      QRenderRule::configurePalette
                (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                 (ColorRole)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                 (ColorRole)in_stack_fffffffffffff6b8);
      pQVar5 = baseStyle((QStyleSheetStyle *)
                         CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,local_628,in_RCX,in_R8);
      QStyleOptionTabWidgetFrame::~QStyleOptionTabWidgetFrame
                ((QStyleOptionTabWidgetFrame *)0x4397e0);
    }
    else {
      QRenderRule::drawRule
                (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                 (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
    goto LAB_00439da9;
  case 0xd:
  case 0xf:
    pQVar7 = qobject_cast<QAbstractButton_const*>((QObject *)0x438613);
    if (((pQVar7 == (QAbstractButton *)0x0) ||
        (bVar1 = QRenderRule::hasBackground(in_stack_fffffffffffff630), !bVar1)) ||
       (bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630), !bVar1)) {
      bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
      if (bVar1) break;
      QRenderRule::boxRect
                (in_stack_fffffffffffff658,in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
      QRenderRule::drawRule
                (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                 (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    }
    else {
      QWindowsStyle::drawPrimitive
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      QRenderRule::background((QRenderRule *)0x438682);
      uVar8 = QPixmap::isNull();
      if (((uVar8 & 1) == 0) || (bVar1 = QRenderRule::hasImage(in_stack_fffffffffffff620), bVar1)) {
        QRenderRule::boxRect
                  (in_stack_fffffffffffff658,in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
        QRect::adjusted((QRect *)in_stack_fffffffffffff658,
                        (int)((ulong)in_stack_fffffffffffff650 >> 0x20),
                        (int)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                        in_stack_fffffffffffff648);
        QRenderRule::drawRule
                  (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                   (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      }
    }
    goto LAB_00439da9;
  case 0x10:
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    goto joined_r0x0043929f;
  case 0x12:
    pQVar10 = qstyleoption_cast<QStyleOptionFrame_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionFrame *)0x0) {
      if ((in_R8 != (QRenderRule *)0x0) &&
         (in_stack_fffffffffffff768 =
               (QRenderRule *)
               containerWidget((QWidget *)
                               CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)),
         in_stack_fffffffffffff768 != in_R8)) {
        memset(local_2e0,0xaa,0x88);
        renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760)
                   ,(QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
                   in_stack_fffffffffffff74c);
        bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
        if ((bVar1) &&
           (bVar1 = QRenderRule::baseStyleCanDraw
                              ((QRenderRule *)
                               CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618)), bVar1
           )) {
          QRenderRule::operator=
                    (in_stack_fffffffffffff620,
                     (QRenderRule *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
          bVar1 = false;
        }
        else {
          bVar1 = true;
        }
        QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
        if (bVar1) goto LAB_00439da9;
      }
      bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
      if (bVar1) {
        memset(local_330,0xaa,0x50);
        QStyleOptionFrame::QStyleOptionFrame
                  ((QStyleOptionFrame *)in_stack_fffffffffffff620,
                   (QStyleOptionFrame *)
                   CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        QRenderRule::configurePalette
                  (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                   (ColorRole)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                   (ColorRole)in_stack_fffffffffffff6b8);
        QVar13 = QRenderRule::borderRect
                           (in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630);
        local_7a8 = QVar13._0_8_;
        local_320 = local_7a8;
        local_7a0 = QVar13._8_8_;
        local_318 = local_7a0;
        bVar1 = QRenderRule::baseStyleCanDraw
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        if (bVar1) {
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                         in_stack_fffffffffffff618);
          QRenderRule::drawBackgroundImage
                    (in_stack_fffffffffffff768,
                     (QPainter *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                     in_stack_fffffffffffff758,in_stack_fffffffffffff808);
          pQVar5 = baseStyle((QStyleSheetStyle *)
                             CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
          (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,local_330,in_RCX,in_R8);
        }
        else {
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                         in_stack_fffffffffffff618);
          QRenderRule::drawBackground
                    (in_stack_fffffffffffff668,(QPainter *)in_stack_fffffffffffff660,
                     (QRect *)in_stack_fffffffffffff658,(QPoint *)in_stack_fffffffffffff650);
          if (0 < local_2f0) {
            pQVar5 = baseStyle((QStyleSheetStyle *)
                               CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
            (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,5,local_330,in_RCX,in_R8);
          }
        }
        QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x438d24);
      }
      else {
        QRenderRule::drawRule
                  (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                   (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      }
    }
    goto LAB_00439da9;
  case 0x13:
    local_874 = 1;
    break;
  case 0x14:
    local_874 = 3;
    break;
  case 0x15:
    local_874 = 4;
    break;
  case 0x16:
    local_874 = 2;
    break;
  case 0x17:
    pQVar12 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RDX);
    if (pQVar12 != (QStyleOptionViewItem *)0x0) {
      memset(local_4c8,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
                 in_stack_fffffffffffff74c);
      bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
      if (bVar1) {
        pQVar5 = QStyle::proxy((QStyle *)in_stack_fffffffffffff630);
        (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,0x2d,pQVar12,in_RCX,in_R8);
        QRenderRule::drawRule
                  (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                   (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      }
      else {
        pQVar5 = baseStyle((QStyleSheetStyle *)
                           CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
        (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,pQVar12,in_RCX,in_R8);
      }
      QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
    }
    goto LAB_00439da9;
  case 0x18:
    memset(local_208,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
               (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
    if (bVar1) {
      local_878 = 2;
    }
    else {
      QRenderRule::drawBorder
                (in_stack_fffffffffffff660,(QPainter *)in_stack_fffffffffffff658,
                 in_stack_fffffffffffff650);
      local_878 = 1;
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
joined_r0x00438866:
    if (local_878 == 2) break;
    goto LAB_00439da9;
  case 0x19:
    local_874 = 0x4d;
    break;
  case 0x1a:
    local_874 = 5;
    break;
  case 0x1b:
    local_874 = 0x3d;
    break;
  case 0x1c:
    pQVar6 = qstyleoption_cast<QStyleOptionHeader_const*>(in_RDX);
    if ((pQVar6 != (QStyleOptionHeader *)0x0) && (local_874 = 0x2c, pQVar6->sortIndicator == SortUp)
       ) {
      local_874 = 0x2b;
    }
    break;
  case 0x1d:
    local_874 = 0x25;
    break;
  case 0x1e:
    local_874 = 0x2d;
    break;
  case 0x1f:
    local_874 = 6;
    break;
  case 0x20:
  case 0x21:
    local_874 = 0xe;
    break;
  case 0x22:
  case 0x23:
    local_874 = 0xc;
    break;
  case 0x24:
  case 0x25:
    in_stack_fffffffffffff74c = 0x22;
    if (in_ESI == 0x24) {
      in_stack_fffffffffffff74c = 0x21;
    }
    memset(local_440,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
               (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    if (bVar1) {
      QRenderRule::drawRule
                (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                 (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
joined_r0x0043929f:
    if (!bVar1) break;
    goto LAB_00439da9;
  case 0x26:
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    if (!bVar1) break;
    pQVar10 = qstyleoption_cast<QStyleOptionFrame_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionFrame *)0x0) {
      bVar1 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff630);
      if (bVar1) {
        this_00 = (QRenderRule *)&in_RDX->rect;
        pQVar9 = in_RCX;
        QPoint::QPoint((QPoint *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                       in_stack_fffffffffffff618);
        QRenderRule::drawBackground
                  (this_00,(QPainter *)pQVar9,(QRect *)in_stack_fffffffffffff658,
                   (QPoint *)in_stack_fffffffffffff650);
        memset(local_518,0xaa,0x50);
        QStyleOptionFrame::QStyleOptionFrame
                  ((QStyleOptionFrame *)in_stack_fffffffffffff620,
                   (QStyleOptionFrame *)
                   CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        QVar13 = QRenderRule::borderRect
                           (in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630);
        local_810._0_8_ = QVar13._0_8_;
        local_508._0_4_ = local_810.x1.m_i;
        local_508._4_4_ = local_810.y1.m_i;
        local_810._8_8_ = QVar13._8_8_;
        local_500._0_4_ = local_810.x2.m_i;
        local_500._4_4_ = local_810.y2.m_i;
        local_810 = QVar13;
        QBrush::QBrush(local_818,NoBrush);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                           (QBrush *)0x4395b5);
        QBrush::~QBrush(local_818);
        pQVar5 = baseStyle((QStyleSheetStyle *)
                           CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
        (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,local_518,in_RCX,in_R8);
        QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x439607);
      }
      else {
        QRenderRule::drawRule
                  (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                   (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      }
    }
    goto LAB_00439da9;
  case 0x27:
    local_874 = 0x30;
    break;
  case 0x28:
    local_874 = 0x4e;
    break;
  case 0x29:
    if ((in_R8 == (QRenderRule *)0x0) ||
       (bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620), bVar1)) {
      in_stack_fffffffffffff758 =
           (QRect *)qobject_cast<QAbstractScrollArea_const*>((QObject *)0x438ee5);
      if (in_stack_fffffffffffff758 == (QRect *)0x0) goto switchD_0043848e_caseD_2e;
      in_stack_fffffffffffff750 = QAbstractScrollArea::d_func((QAbstractScrollArea *)0x438f09);
      (**(code **)(*(long *)&(in_stack_fffffffffffff750->super_QFramePrivate).super_QWidgetPrivate +
                  0xb8))();
      QRenderRule::drawBackground
                (in_stack_fffffffffffff668,(QPainter *)in_stack_fffffffffffff660,
                 (QRect *)in_stack_fffffffffffff658,(QPoint *)in_stack_fffffffffffff650);
      bVar1 = QRenderRule::hasBorder(in_stack_fffffffffffff620);
      if (bVar1) {
        QRenderRule::borderRect(in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630);
        iVar3 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle
                            + 0xf0))(in_RDI,0x11,in_RDX,in_R8,0);
        if (iVar3 != 0) {
          QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffff620);
          bVar1 = QWidget::isVisible((QWidget *)0x439029);
          if (bVar1) {
            QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffff620)
            ;
            QWidget::width((QWidget *)0x439044);
          }
          QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffff620)
          ;
          bVar1 = QWidget::isVisible((QWidget *)0x439075);
          if (bVar1) {
            QAbstractScrollArea::horizontalScrollBar
                      ((QAbstractScrollArea *)in_stack_fffffffffffff620);
            QWidget::height((QWidget *)0x439090);
          }
          QRect::adjusted((QRect *)in_stack_fffffffffffff658,
                          (int)((ulong)in_stack_fffffffffffff650 >> 0x20),
                          (int)in_stack_fffffffffffff650,in_stack_fffffffffffff64c,
                          in_stack_fffffffffffff648);
          QStyle::visualRect(in_stack_fffffffffffff64c,in_stack_fffffffffffff640,
                             (QRect *)in_stack_fffffffffffff638);
        }
        QRenderRule::drawBorder
                  (in_stack_fffffffffffff660,(QPainter *)in_stack_fffffffffffff658,
                   in_stack_fffffffffffff650);
      }
    }
    else {
      pQVar9 = (QRenderRule *)
               containerWidget((QWidget *)
                               CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      bVar1 = QSet<const_QWidget_*>::contains
                        ((QSet<const_QWidget_*> *)in_stack_fffffffffffff620,
                         (QWidget **)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
      in_stack_fffffffffffff767 = 0;
      local_949 = 0;
      if (bVar1) {
        local_94a = 1;
        if (pQVar9 != in_R8) {
          renderRule((QStyleSheetStyle *)(ulong)in_stack_fffffffffffff760,
                     (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
                     in_stack_fffffffffffff74c);
          in_stack_fffffffffffff767 = 1;
          bVar1 = QRenderRule::hasBackground(in_stack_fffffffffffff630);
          local_94a = bVar1 ^ 0xff;
        }
        local_949 = local_94a;
      }
      if ((in_stack_fffffffffffff767 & 1) != 0) {
        QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
      }
      if ((local_949 & 1) != 0) {
        QWidget::backgroundRole
                  ((QWidget *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
        QPalette::brush((QPalette *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c);
        QPainter::fillRect((QRect *)in_RCX,(QBrush *)&in_RDX->rect);
      }
    }
    break;
  case 0x2a:
    pQVar12 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RDX);
    if (pQVar12 == (QStyleOptionViewItem *)0x0) {
      local_874 = 4;
    }
    else {
      local_874 = 4;
      if ((pQVar12->super_QStyleOption).direction == RightToLeft) {
        local_874 = 3;
      }
    }
    break;
  case 0x2c:
    local_874 = 0x4a;
    break;
  case 0x2d:
    pQVar12 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RDX);
    if ((pQVar12 != (QStyleOptionViewItem *)0x0) && (pQVar12->viewItemPosition != Invalid)) {
      memset(local_6b0,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                 (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
                 in_stack_fffffffffffff74c);
      bVar1 = QRenderRule::hasBackground(in_stack_fffffffffffff630);
      if (bVar1) {
        QRenderRule::background((QRenderRule *)0x43993b);
        QBrush::color((QBrush *)0x439947);
        iVar3 = QColor::alpha();
        if (((double)iVar3 != 1.0) || (NAN((double)iVar3))) {
          pQVar5 = baseStyle((QStyleSheetStyle *)
                             CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
          (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,in_RDX,in_RCX,in_R8);
        }
        local_824.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
             (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
             QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                       ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_fffffffffffff620,
                        in_stack_fffffffffffff61c);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_824);
        bVar1 = false;
        if ((IVar4 != 0) &&
           ((pQVar12->viewItemPosition == Beginning ||
            (bVar1 = false, pQVar12->viewItemPosition == OnlyOne)))) {
          bVar1 = QRenderRule::hasBorder(in_stack_fffffffffffff620);
        }
        if (bVar1 == false) {
          local_874 = 0x4a;
          goto LAB_00439b0e;
        }
        bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
        if (bVar1) {
          in_stack_fffffffffffff638 = in_RCX;
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff620,in_stack_fffffffffffff61c,
                         in_stack_fffffffffffff618);
          QRenderRule::drawBackground
                    (in_stack_fffffffffffff668,(QPainter *)in_stack_fffffffffffff660,
                     (QRect *)in_stack_fffffffffffff658,(QPoint *)in_stack_fffffffffffff650);
          pQVar9 = in_RCX;
          QRenderRule::contentsRect(in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630);
          QRenderRule::drawImage
                    (pQVar9,(QPainter *)in_stack_fffffffffffff638,(QRect *)in_stack_fffffffffffff630
                    );
        }
        else {
          pQVar5 = baseStyle((QStyleSheetStyle *)
                             CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
          (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,in_RDX,in_RCX,in_R8);
        }
        bVar1 = true;
      }
      else {
LAB_00439b0e:
        bVar1 = false;
      }
      QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
      if (bVar1) goto LAB_00439da9;
    }
    break;
  case 0x2e:
  case 0x30:
switchD_0043848e_caseD_2e:
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    if (!bVar1) break;
    QRenderRule::drawRule
              (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
               (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    goto LAB_00439da9;
  case 0x2f:
    if (in_R8 != (QRenderRule *)0x0) {
      in_stack_fffffffffffff630 =
           (QRenderRule *)
           baseStyle((QStyleSheetStyle *)
                     CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      ::QVariant::fromValue<void_*,_true>
                ((void **)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      QObject::setProperty
                ((QObject *)in_stack_fffffffffffff620,
                 (char *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                 (QVariant *)0x439bd9);
      ::QVariant::~QVariant(&local_28);
      local_870 = (QRenderRule *)QWidget::parentWidget((QWidget *)0x439bf3);
    }
    local_874 = 0x4f;
  }
  if (local_874 == 0) {
    pQVar5 = baseStyle((QStyleSheetStyle *)
                       CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,in_RDX,in_RCX,local_870);
  }
  else {
    memset(local_738,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
               (QObject *)in_stack_fffffffffffff758,(QStyleOption *)in_stack_fffffffffffff750,
               in_stack_fffffffffffff74c);
    bVar1 = QRenderRule::hasDrawable(in_stack_fffffffffffff620);
    if (bVar1) {
      QRenderRule::drawRule
                (in_stack_fffffffffffff638,(QPainter *)in_stack_fffffffffffff630,
                 (QRect *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
    }
    else {
      pQVar5 = baseStyle((QStyleSheetStyle *)
                         CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
      (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,in_ESI,in_RDX,in_RCX,local_870);
    }
    QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
  }
  baseStyle((QStyleSheetStyle *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628));
  QObject::property((char *)&local_48);
  bVar2 = ::QVariant::toBool();
  ::QVariant::~QVariant(&local_48);
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffff620 =
         (QRenderRule *)baseStyle((QStyleSheetStyle *)CONCAT17(bVar2,in_stack_fffffffffffff628));
    ::QVariant::QVariant((QVariant *)0x439d78);
    QObject::setProperty
              ((QObject *)in_stack_fffffffffffff620,
               (char *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
               (QVariant *)0x439d91);
    ::QVariant::~QVariant(&local_68);
  }
LAB_00439da9:
  QRenderRule::~QRenderRule(in_stack_fffffffffffff620);
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_739);
LAB_00439dc3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::drawPrimitive(PrimitiveElement pe, const QStyleOption *opt, QPainter *p,
                                     const QWidget *w) const
{
    RECURSION_GUARD(baseStyle()->drawPrimitive(pe, opt, p, w); return)

    int pseudoElement = PseudoElement_None;
    QRenderRule rule = renderRule(w, opt);
    QRect rect = opt->rect;

    switch (pe) {

    case PE_FrameStatusBarItem: {
        QRenderRule subRule = renderRule(w ? w->parentWidget() : nullptr, opt, PseudoElement_Item);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
        break;
                            }

    case PE_IndicatorArrowDown:
        pseudoElement = PseudoElement_DownArrow;
        break;

    case PE_IndicatorArrowUp:
        pseudoElement = PseudoElement_UpArrow;
        break;

    case PE_IndicatorRadioButton:
        pseudoElement = PseudoElement_ExclusiveIndicator;
        break;

    case PE_IndicatorItemViewItemCheck:
        pseudoElement = PseudoElement_ViewItemIndicator;
        break;

    case PE_IndicatorCheckBox:
        pseudoElement = PseudoElement_Indicator;
        break;

    case PE_IndicatorHeaderArrow:
        if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            pseudoElement = hdr->sortIndicator == QStyleOptionHeader::SortUp
                ? PseudoElement_HeaderViewUpArrow
                : PseudoElement_HeaderViewDownArrow;
        }
        break;

    case PE_PanelButtonTool:
    case PE_PanelButtonCommand:
#if QT_CONFIG(abstractbutton)
        if (qobject_cast<const QAbstractButton *>(w) && rule.hasBackground() && rule.hasNativeBorder()) {
            //the window style will draw the borders
            ParentStyle::drawPrimitive(pe, opt, p, w);
            if (!rule.background()->pixmap.isNull() || rule.hasImage()) {
                rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin).adjusted(1,1,-1,-1));
            }
            return;
        }
#endif
        if (!rule.hasNativeBorder()) {
            rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin));
            return;
        }
        break;

    case PE_IndicatorButtonDropDown: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
        if (!subRule.hasNativeBorder()) {
            rule.drawBorder(p, opt->rect);
            return;
        }
        break;
                                     }

    case PE_FrameDefaultButton:
        if (rule.hasNativeBorder()) {
            if (rule.baseStyleCanDraw())
                break;
            QWindowsStyle::drawPrimitive(pe, opt, p, w);
        }
        return;

    case PE_FrameWindow:
    case PE_FrameDockWidget:
    case PE_Frame:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
            } else {
                rule.drawBorder(p, rule.borderRect(opt->rect));
            }
        }
        return;

    case PE_PanelLineEdit:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            // Fall back to container widget's render rule
            if (w) {
                if (QWidget *container = containerWidget(w); container != w) {
                    QRenderRule containerRule = renderRule(container, opt);
                    if (!containerRule.hasNativeBorder() || !containerRule.baseStyleCanDraw())
                        return;
                    rule = containerRule;
                }
            }

            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                frmOpt.rect = rule.borderRect(frmOpt.rect);
                if (rule.baseStyleCanDraw()) {
                    rule.drawBackgroundImage(p, opt->rect);
                    baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
                } else {
                    rule.drawBackground(p, opt->rect);
                    if (frmOpt.lineWidth > 0)
                        baseStyle()->drawPrimitive(PE_FrameLineEdit, &frmOpt, p, w);
                }
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_Widget:
        if (w && !rule.hasDrawable()) {
            QWidget *container = containerWidget(w);
            if (styleSheetCaches->autoFillDisabledWidgets.contains(container)
                && (container == w || !renderRule(container, opt).hasBackground())) {
                //we do not have a background, but we disabled the autofillbackground anyway. so fill the background now.
                // (this may happen if we have rules like :focus)
                p->fillRect(opt->rect, opt->palette.brush(w->backgroundRole()));
            }
            break;
        }
#if QT_CONFIG(scrollarea)
        if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w)) {
            const QAbstractScrollAreaPrivate *sap = sa->d_func();
            rule.drawBackground(p, opt->rect, sap->contentsOffset());
            if (rule.hasBorder()) {
                QRect brect = rule.borderRect(opt->rect);
                if (styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, opt, w)) {
                    QRect r = brect.adjusted(0, 0, sa->verticalScrollBar()->isVisible() ? -sa->verticalScrollBar()->width() : 0,
                                             sa->horizontalScrollBar()->isVisible() ? -sa->horizontalScrollBar()->height() : 0);
                    brect = QStyle::visualRect(opt->direction, brect, r);
                }
                rule.drawBorder(p, brect);
            }
            break;
        }
#endif
        Q_FALLTHROUGH();
    case PE_PanelMenu:
    case PE_PanelStatusBar:
        if (rule.hasDrawable()) {
            rule.drawRule(p, opt->rect);
            return;
        }
    break;

    case PE_FrameMenu:
        if (rule.hasDrawable()) {
            // Drawn by PE_PanelMenu
            return;
        }
        break;

    case PE_PanelMenuBar:
    if (rule.hasDrawable()) {
        // Drawn by PE_Widget
        return;
    }
    break;

    case PE_IndicatorToolBarSeparator:
    case PE_IndicatorToolBarHandle: {
        PseudoElement ps = pe == PE_IndicatorToolBarHandle ? PseudoElement_ToolBarHandle : PseudoElement_ToolBarSeparator;
        QRenderRule subRule = renderRule(w, opt, ps);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
                                    }
        break;

    case PE_IndicatorMenuCheckMark:
        pseudoElement = PseudoElement_MenuCheckMark;
        break;

    case PE_IndicatorArrowLeft:
        pseudoElement = PseudoElement_LeftArrow;
        break;

    case PE_IndicatorArrowRight:
        pseudoElement = PseudoElement_RightArrow;
        break;

    case PE_IndicatorColumnViewArrow:
#if QT_CONFIG(itemviews)
        if (const QStyleOptionViewItem *viewOpt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            bool reverse = (viewOpt->direction == Qt::RightToLeft);
            pseudoElement = reverse ? PseudoElement_LeftArrow : PseudoElement_RightArrow;
        } else
#endif
        {
            pseudoElement = PseudoElement_RightArrow;
        }
        break;

#if QT_CONFIG(itemviews)
    case PE_IndicatorBranch:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TreeViewBranch);
            if (subRule.hasDrawable()) {
                proxy()->drawPrimitive(PE_PanelItemViewRow, vopt, p, w);
                subRule.drawRule(p, opt->rect);
            } else {
                baseStyle()->drawPrimitive(pe, vopt, p, w);
            }
        }
        return;
#endif // QT_CONFIG(itemviews)

    case PE_PanelTipLabel:
        if (!rule.hasDrawable())
            break;

        if (const QStyleOptionFrame *frmOpt = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                rule.drawBackground(p, opt->rect);
                QStyleOptionFrame optCopy(*frmOpt);
                optCopy.rect = rule.borderRect(opt->rect);
                optCopy.palette.setBrush(QPalette::Window, Qt::NoBrush); // oh dear
                baseStyle()->drawPrimitive(pe, &optCopy, p, w);
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_FrameGroupBox:
        if (rule.hasNativeBorder())
            break;
        rule.drawBorder(p, opt->rect);
        return;

#if QT_CONFIG(tabwidget)
    case PE_FrameTabWidget:
        if (const QStyleOptionTabWidgetFrame *frm = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TabWidgetPane);
            if (subRule.hasNativeBorder()) {
                subRule.drawBackground(p, opt->rect);
                QStyleOptionTabWidgetFrame frmCopy(*frm);
                subRule.configurePalette(&frmCopy.palette, QPalette::WindowText, QPalette::Window);
                baseStyle()->drawPrimitive(pe, &frmCopy, p, w);
            } else {
                subRule.drawRule(p, opt->rect);
            }
            return;
        }
        break;
#endif // QT_CONFIG(tabwidget)

    case PE_IndicatorProgressChunk:
        pseudoElement = PseudoElement_ProgressBarChunk;
        break;

    case PE_IndicatorTabTear:
        pseudoElement = PseudoElement_TabBarTear;
        break;

    case PE_FrameFocusRect:
        if (!rule.hasNativeOutline()) {
            rule.drawOutline(p, opt->rect);
            return;
        }
        break;

    case PE_IndicatorDockWidgetResizeHandle:
        pseudoElement = PseudoElement_DockWidgetSeparator;
        break;

    case PE_PanelItemViewRow:
        // For compatibility reasons, QTreeView draws different parts of
        // the background of an item row separately, before calling the
        // delegate to draw the item. The row background of an item is
        // however not separately styleable through a style sheet, but
        // only indirectly through the background of the item. To get the
        // same background for all parts drawn by QTreeView, we have to
        // use the background rule for the item here.
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            // default handling for drawing empty space
            if (vopt->viewItemPosition == QStyleOptionViewItem::Invalid)
                break;
            if (QRenderRule rule = renderRule(w, opt, PseudoElement_ViewItem); rule.hasBackground()) {
                // if the item background is not fully opaque, then we have to paint the row
                if (rule.background()->brush.color().alpha() != 1.0)
                    baseStyle()->drawPrimitive(pe, opt, p, w);
                // Skip border for the branch and draw only the brackground
                if (vopt->features & QStyleOptionViewItem::IsDecorationForRootColumn &&
                    (vopt->viewItemPosition == QStyleOptionViewItem::Beginning ||
                     vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne) && rule.hasBorder()) {
                    if (rule.hasDrawable()) {
                        rule.drawBackground(p, rect);
                        rule.drawImage(p, rule.contentsRect(rect));
                    } else {
                        baseStyle()->drawPrimitive(pe, opt, p, w);
                    }
                    return;
                }
                pseudoElement = PseudoElement_ViewItem;
            }
        }
        break;
    case PE_PanelItemViewItem:
        pseudoElement = PseudoElement_ViewItem;
        break;

    case PE_PanelScrollAreaCorner:
        pseudoElement = PseudoElement_ScrollAreaCorner;
        break;

    case PE_IndicatorSpinDown:
    case PE_IndicatorSpinMinus:
        pseudoElement = PseudoElement_SpinBoxDownArrow;
        break;

    case PE_IndicatorSpinUp:
    case PE_IndicatorSpinPlus:
        pseudoElement = PseudoElement_SpinBoxUpArrow;
        break;
#if QT_CONFIG(tabbar)
    case PE_IndicatorTabClose:
        if (w) {
            // QMacStyle needs a real widget, not its parent - to implement
            // 'document mode' properly, drawing nothing if a tab is not hovered.
            baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant::fromValue((void *)w));
            w = w->parentWidget(); //match on the QTabBar instead of the CloseButton
        }
        pseudoElement = PseudoElement_TabBarTabCloseButton;
        break;
#endif

    default:
        break;
    }

    if (pseudoElement != PseudoElement_None) {
        QRenderRule subRule = renderRule(w, opt, pseudoElement);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, rect);
        } else {
            baseStyle()->drawPrimitive(pe, opt, p, w);
        }
    } else {
        baseStyle()->drawPrimitive(pe, opt, p, w);
    }

    if (baseStyle()->property("_q_styleSheetRealCloseButton").toBool())
        baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant());
}